

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

MergeResult
mergesort_lcp_2way_parallel<false>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  MergeResult MVar1;
  MergeResult MVar2;
  ulong n_00;
  MergeResult mr;
  MergeResult ml;
  size_t split0;
  size_t n_local;
  lcp_t *lcp_output_local;
  lcp_t *lcp_input_local;
  uchar **strings_output_local;
  uchar **strings_input_local;
  
  if (n == 0) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x121,
                  "MergeResult mergesort_lcp_2way_parallel(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = false]"
                 );
  }
  if (n < 0x10000) {
    strings_input_local._4_4_ =
         mergesort_lcp_2way<true>(strings_input,strings_output,lcp_input,lcp_output,n);
  }
  else {
    n_00 = n >> 1;
    MVar1 = mergesort_lcp_2way_parallel<true>
                      (strings_input,strings_output,lcp_input,lcp_output,n_00);
    MVar2 = mergesort_lcp_2way_parallel<true>
                      (strings_input + n_00,strings_output + n_00,lcp_input + n_00,lcp_output + n_00
                       ,n - n_00);
    if (MVar1 != MVar2) {
      if (MVar1 != SortedInPlace) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x13c,
                      "MergeResult mergesort_lcp_2way_parallel(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = false]"
                     );
      }
      std::copy<unsigned_char**,unsigned_char**>
                (strings_output + n_00,strings_output + n,strings_input + n_00);
      std::copy<unsigned_long*,unsigned_long*>(lcp_output + n_00,lcp_output + n,lcp_input + n_00);
    }
    if (MVar1 == SortedInPlace) {
      merge_lcp_2way<false>
                (strings_input,lcp_input,n_00,strings_input + n_00,lcp_input + n_00,n - n_00,
                 strings_output,lcp_output);
      strings_input_local._4_4_ = SortedInTemp;
    }
    else {
      merge_lcp_2way<false>
                (strings_output,lcp_output,n_00,strings_output + n_00,lcp_output + n_00,n - n_00,
                 strings_input,lcp_input);
      strings_input_local._4_4_ = SortedInPlace;
    }
  }
  return strings_input_local._4_4_;
}

Assistant:

MergeResult
mergesort_lcp_2way_parallel(
		unsigned char** restrict strings_input,
		unsigned char** restrict strings_output,
		lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
		size_t n)
{
	assert(n > 0);
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 0x10000)
		return mergesort_lcp_2way<true>(
				strings_input, strings_output,
				lcp_input, lcp_output, n);
	const size_t split0 = n/2;
	MergeResult ml, mr;
#pragma omp task shared(ml)
	ml = mergesort_lcp_2way_parallel<true>(
			strings_input, strings_output,
			lcp_input,     lcp_output,
			split0);
#pragma omp task shared(mr)
	mr = mergesort_lcp_2way_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			n-split0);
#pragma omp taskwait
	if (ml != mr) {
		if (ml == SortedInPlace) {
			std::copy(strings_output+split0, strings_output+n,
					strings_input+split0);
			std::copy(lcp_output+split0, lcp_output+n,
					lcp_input+split0);
			mr = SortedInPlace;
		} else {
			assert(0);
			abort();
		}
	}
	if (ml == SortedInPlace) {
		merge_lcp_2way<OutputLCP>(
		           strings_input,        lcp_input,        split0,
		           strings_input+split0, lcp_input+split0, n-split0,
		           strings_output, lcp_output);
		return SortedInTemp;
	} else {
		merge_lcp_2way<OutputLCP>(
		           strings_output,        lcp_output,        split0,
		           strings_output+split0, lcp_output+split0, n-split0,
		           strings_input, lcp_input);
		return SortedInPlace;
	}
}